

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::encode(string *filename,uchar *in,uint w,uint h,LodePNGColorType colortype,
                    uint bitdepth)

{
  uint uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint error;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string *filename_00;
  uint in_stack_ffffffffffffffb4;
  uint local_3c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  filename_00 = (string *)&stack0xffffffffffffffc8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1344bf);
  uVar1 = encode(in_RSI,(uchar *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8);
  local_3c = uVar1;
  if (uVar1 == 0) {
    local_3c = save_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((ulong)in_stack_ffffffffffffffb4 << 0x20),filename_00);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,uVar1));
  return local_3c;
}

Assistant:

unsigned encode(const std::string& filename,
                const unsigned char* in, unsigned w, unsigned h,
                LodePNGColorType colortype, unsigned bitdepth) {
  std::vector<unsigned char> buffer;
  unsigned error = encode(buffer, in, w, h, colortype, bitdepth);
  if(!error) error = save_file(buffer, filename);
  return error;
}